

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2polygon.cc
# Opt level: O0

void __thiscall
S2Polygon::InitNested
          (S2Polygon *this,
          vector<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>,_std::allocator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_>_>
          *loops)

{
  bool bVar1;
  int iVar2;
  S2Loop *new_loop;
  reference this_00;
  unique_ptr<S2Loop,_std::default_delete<S2Loop>_> *loop;
  iterator __end1;
  iterator __begin1;
  vector<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>,_std::allocator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_>_>
  *__range1;
  int local_4c;
  undefined1 local_48 [4];
  int i;
  LoopMap loop_map;
  vector<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>,_std::allocator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_>_>
  *loops_local;
  S2Polygon *this_local;
  
  loop_map._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)loops;
  ClearLoops(this);
  std::
  vector<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>,_std::allocator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_>_>
  ::swap(&this->loops_,loops);
  iVar2 = num_loops(this);
  if (iVar2 == 1) {
    InitOneLoop(this);
  }
  else {
    std::
    map<S2Loop_*,_std::vector<S2Loop_*,_std::allocator<S2Loop_*>_>,_std::less<S2Loop_*>,_std::allocator<std::pair<S2Loop_*const,_std::vector<S2Loop_*,_std::allocator<S2Loop_*>_>_>_>_>
    ::map((map<S2Loop_*,_std::vector<S2Loop_*,_std::allocator<S2Loop_*>_>,_std::less<S2Loop_*>,_std::allocator<std::pair<S2Loop_*const,_std::vector<S2Loop_*,_std::allocator<S2Loop_*>_>_>_>_>
           *)local_48);
    local_4c = 0;
    while( true ) {
      iVar2 = num_loops(this);
      if (iVar2 <= local_4c) break;
      new_loop = S2Polygon::loop(this,local_4c);
      InsertLoop(this,new_loop,(S2Loop *)0x0,(LoopMap *)local_48);
      local_4c = local_4c + 1;
    }
    __end1 = std::
             vector<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>,_std::allocator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_>_>
             ::begin(&this->loops_);
    loop = (unique_ptr<S2Loop,_std::default_delete<S2Loop>_> *)
           std::
           vector<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>,_std::allocator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_>_>
           ::end(&this->loops_);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        (&__end1,(__normal_iterator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_*,_std::vector<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>,_std::allocator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_>_>_>
                                  *)&loop);
      if (!bVar1) break;
      this_00 = __gnu_cxx::
                __normal_iterator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_*,_std::vector<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>,_std::allocator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_>_>_>
                ::operator*(&__end1);
      std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>::release(this_00);
      __gnu_cxx::
      __normal_iterator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_*,_std::vector<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>,_std::allocator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_>_>_>
      ::operator++(&__end1);
    }
    std::
    vector<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>,_std::allocator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_>_>
    ::clear(&this->loops_);
    InitLoops(this,(LoopMap *)local_48);
    InitLoopProperties(this);
    std::
    map<S2Loop_*,_std::vector<S2Loop_*,_std::allocator<S2Loop_*>_>,_std::less<S2Loop_*>,_std::allocator<std::pair<S2Loop_*const,_std::vector<S2Loop_*,_std::allocator<S2Loop_*>_>_>_>_>
    ::~map((map<S2Loop_*,_std::vector<S2Loop_*,_std::allocator<S2Loop_*>_>,_std::less<S2Loop_*>,_std::allocator<std::pair<S2Loop_*const,_std::vector<S2Loop_*,_std::allocator<S2Loop_*>_>_>_>_>
            *)local_48);
  }
  return;
}

Assistant:

void S2Polygon::InitNested(vector<unique_ptr<S2Loop>> loops) {
  ClearLoops();
  loops_.swap(loops);

  if (num_loops() == 1) {
    InitOneLoop();
    return;
  }
  LoopMap loop_map;
  for (int i = 0; i < num_loops(); ++i) {
    InsertLoop(loop(i), nullptr, &loop_map);
  }
  // Reorder the loops in depth-first traversal order.
  // Loops are now owned by loop_map, don't let them be
  // deleted by clear().
  for (auto& loop : loops_) loop.release();
  loops_.clear();
  InitLoops(&loop_map);

  // Compute num_vertices_, bound_, subregion_bound_.
  InitLoopProperties();
}